

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_GLSL_end(Context *ctx)

{
  char *pcVar1;
  int iVar2;
  char *shstr;
  Context *ctx_local;
  
  iVar2 = shader_is_pixel(ctx);
  if ((iVar2 == 0) || (iVar2 = shader_version_atleast(ctx,'\x02','\0'), iVar2 != 0)) {
    shader_is_vertex(ctx);
  }
  else {
    pcVar1 = ctx->shader_type_str;
    set_used_register(ctx,REG_TYPE_COLOROUT,0,1);
    output_line(ctx,"%s_oC0 = %s_r0;",pcVar1,pcVar1);
  }
  if (ctx->previous_opcode != 0x1c) {
    emit_GLSL_RET(ctx);
  }
  return;
}

Assistant:

static void emit_GLSL_end(Context *ctx)
{
    // ps_1_* writes color to r0 instead oC0. We move it to the right place.
    // We don't have to worry about a RET opcode messing this up, since
    //  RET isn't available before ps_2_0.
    if (shader_is_pixel(ctx) && !shader_version_atleast(ctx, 2, 0))
    {
        const char *shstr = ctx->shader_type_str;
        set_used_register(ctx, REG_TYPE_COLOROUT, 0, 1);
        output_line(ctx, "%s_oC0 = %s_r0;", shstr, shstr);
    } // if
    else if (shader_is_vertex(ctx))
    {
#ifdef MOJOSHADER_FLIP_RENDERTARGET
        output_line(ctx, "gl_Position.y = gl_Position.y * vpFlip;");
#endif
#ifdef MOJOSHADER_DEPTH_CLIPPING
        output_line(ctx, "gl_Position.z = gl_Position.z * 2.0 - gl_Position.w;");
#endif
    } // else if

    // force a RET opcode if we're at the end of the stream without one.
    if (ctx->previous_opcode != OPCODE_RET)
        emit_GLSL_RET(ctx);
}